

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.h
# Opt level: O0

void __thiscall HEkkDualRow::HEkkDualRow(HEkkDualRow *this,HEkk *simplex)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 0xffffffff;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = 0;
  in_RDI[6] = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x77a417);
  *(undefined4 *)(in_RDI + 0xd) = 0;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x77a42b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x77a43b);
  in_RDI[0x14] = 0;
  in_RDI[0x15] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0;
  *(undefined4 *)((long)in_RDI + 0xc4) = 0;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x77a48b);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x77a49b);
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x77a4b5);
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)0x77a4c5);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x77a4d5);
  in_RDI[0x29] = 0;
  return;
}

Assistant:

HEkkDualRow(HEkk& simplex) : ekk_instance_(simplex) {}